

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O3

int __thiscall Js::JavascriptMap::Size(JavascriptMap *this)

{
  bool bVar1;
  Type TVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  
  pTVar3 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  TVar2 = this->kind;
  uVar6 = (uint)TVar2;
  if (TVar2 != EmptyMap) {
    if ((TVar2 == ComplexVarMap) || (TVar2 == SimpleVarMap)) {
      uVar6 = *(int *)((this->u).field2 + 0x20) - *(int *)((this->u).field2 + 0x28);
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                  ,0x26c,"((0))","(0)");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
      uVar6 = 0;
    }
  }
  pTVar3->noJsReentrancy = bVar1;
  return uVar6;
}

Assistant:

int JavascriptMap::Size()
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());

    switch (this->kind)
    {
    case MapKind::EmptyMap:
        return 0;

    case MapKind::SimpleVarMap:
        return this->u.simpleVarMap->Count();

    case MapKind::ComplexVarMap:
        return this->u.complexVarMap->Count();

    default:
        Assume(UNREACHED);
        return 0;
    }
}